

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTests(Config *config)

{
  pointer pbVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_01;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_02;
  pointer pcVar4;
  pointer pbVar5;
  pointer _str;
  Colour colourGuard;
  TextAttributes nameAttr;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TextAttributes tagsAttr;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [16];
  pointer local_c0;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_b8;
  TagAliasRegistry *local_a0;
  TestSpec local_98;
  Config *local_80;
  pointer local_78;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_70;
  TextAttributes local_58;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_98.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available test cases:\n",0x1a);
    TagAliasRegistry::get();
    local_f8._16_8_ = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._0_8_ = (pointer)0x0;
    local_d0._8_8_ = (pointer)0x0;
    local_c0 = (pointer)0x0;
    vStack_b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0 = &TagAliasRegistry::get::instance;
    local_128._0_8_ = local_128 + 0x10;
    local_f8._8_8_ = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"*","");
    this = TestSpecParser::parse((TestSpecParser *)local_108,(string *)local_128);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_148,&(this->m_testSpec).m_filters);
    local_58.width =
         (size_t)local_98.m_filters.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.indent =
         (size_t)local_98.m_filters.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_58.initialIndent =
         (size_t)local_98.m_filters.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_98.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
    local_98.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
    local_98.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_148._16_8_;
    local_148._0_8_ = (pointer)0x0;
    local_148._8_8_ = (pointer)0x0;
    local_148._16_8_ = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_58);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_148);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_b8);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._8_8_ != &local_e0) {
      operator_delete((void *)local_f8._8_8_,
                      CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Matching test cases:\n",0x15);
  }
  local_128._16_8_ = 0x4f;
  local_128[0x18] = '\t';
  local_58.initialIndent = 0xffffffffffffffff;
  local_58.width = 0x4f;
  local_58.tabChar = '\t';
  local_128._0_8_ = (pointer)0x2;
  local_128._8_8_ = 4;
  local_58.indent = 6;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])(pIVar3);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
                        ((long *)CONCAT44(extraout_var_01,iVar2),config);
  filterTests(&local_70,testCases,&local_98,(IConfig *)config);
  local_78 = local_70.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pcVar4 = (pointer)0x0;
  _str = local_70.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_80 = config;
  if (local_70.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_148._0_8_ = local_148._0_8_ & 0xffffffffffffff00;
      Colour::use((int)((_str->super_TestCaseInfo).properties << 0x1e) >> 0x1f & FileName);
      Tbc::Text::Text((Text *)local_108,(string *)_str,(TextAttributes *)local_128);
      pbVar1 = local_c0;
      for (pbVar5 = (pointer)local_d0._8_8_; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
        if (pbVar5 != (pointer)local_d0._8_8_) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length
                  );
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_d0 + 8));
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8._0_8_ + 1);
      }
      if ((_str->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        Tbc::Text::Text((Text *)local_108,&(_str->super_TestCaseInfo).tagsAsString,&local_58);
        pbVar1 = local_c0;
        for (pbVar5 = (pointer)local_d0._8_8_; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
          if (pbVar5 != (pointer)local_d0._8_8_) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)(pbVar5->_M_dataplus)._M_p,
                     pbVar5->_M_string_length);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_d0 + 8));
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,local_f8._0_8_ + 1);
        }
      }
      if (local_148[0] == (string)0x0) {
        Colour::use(None);
      }
      pcVar4 = pcVar4 + 1;
      _str = _str + 1;
    } while (_str != local_78);
  }
  iVar2 = (*(local_80->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  local_108 = (undefined1  [8])pcVar4;
  if (*(long *)CONCAT44(extraout_var_02,iVar2) == ((long *)CONCAT44(extraout_var_02,iVar2))[1]) {
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"test case","");
    local_100._M_p = local_f8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_148._0_8_,
               (undefined1 *)
               ((long)&(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                          *)local_148._8_8_)->
                       super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_148._0_8_));
    operator<<((ostream *)&std::cout,(pluralise *)local_108);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  else {
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"matching test case","");
    local_100._M_p = local_f8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_148._0_8_,
               (undefined1 *)
               ((long)&(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                          *)local_148._8_8_)->
                       super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_148._0_8_));
    operator<<((ostream *)&std::cout,(pluralise *)local_108);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  if (local_100._M_p != local_f8 + 8) {
    operator_delete(local_100._M_p,(ulong)(local_f8._8_8_ + 1));
  }
  if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,
                    (ulong)((long)&(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                                      *)local_148._16_8_)->
                                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_70);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_98.m_filters);
  return (size_t)pcVar4;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }